

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetTxInOnly_Test::TestBody(Psbt_SetTxInOnly_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_398;
  Message local_390;
  string local_388;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_3;
  Message local_350;
  ByteData local_348;
  string local_330;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_2;
  Message local_2f8;
  uint32_t local_2f0 [2];
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_1;
  TxInReference txin_r;
  string local_240;
  Txid local_220;
  undefined1 local_200 [8];
  TxIn txin_l;
  string local_168;
  Txid local_148;
  undefined1 local_128 [8];
  TxIn txin_w;
  Message local_90 [3];
  uint32_t local_78;
  uint local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  Psbt psbt;
  Psbt_SetTxInOnly_Test *this_local;
  
  cfd::core::Psbt::Psbt((Psbt *)&gtest_ar.message_);
  local_74 = 0;
  local_78 = cfd::core::Psbt::GetTxInCount((Psbt *)&gtest_ar.message_);
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            (local_70,"0",(int *)"psbt.GetTxInCount()",&local_74,&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&txin_w.super_AbstractTxIn.script_witness_.witness_stack_.
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       ._M_impl.super__Vector_impl_data + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x195,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&txin_w.super_AbstractTxIn.script_witness_.witness_stack_.
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       ._M_impl.super__Vector_impl_data + 0x10),local_90);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&txin_w.super_AbstractTxIn.script_witness_.witness_stack_.
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       ._M_impl.super__Vector_impl_data + 0x10));
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_168,"c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26"
             ,(allocator *)
              ((long)&txin_l.super_AbstractTxIn.script_witness_.witness_stack_.
                      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                      _M_impl.super__Vector_impl_data + 0x17));
  cfd::core::Txid::Txid(&local_148,&local_168);
  cfd::core::TxIn::TxIn((TxIn *)local_128,&local_148,1,0xffffffff);
  cfd::core::Txid::~Txid(&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&txin_l.super_AbstractTxIn.script_witness_.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data + 0x17));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_240,"c0ecc9313d16355d71b96acff5bca43cdb593289e50154bab12cff422a46257d"
             ,(allocator *)
              ((long)&txin_r.super_AbstractTxInReference.script_witness_.witness_stack_.
                      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                      _M_impl.super__Vector_impl_data + 0x17));
  cfd::core::Txid::Txid(&local_220,&local_240);
  cfd::core::TxIn::TxIn((TxIn *)local_200,&local_220,0,0xffffffff);
  cfd::core::Txid::~Txid(&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&txin_r.super_AbstractTxInReference.script_witness_.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data + 0x17));
  cfd::core::TxInReference::TxInReference((TxInReference *)&gtest_ar_1.message_,(TxIn *)local_200);
  cfd::core::Psbt::AddTxIn((Psbt *)&gtest_ar.message_,(TxIn *)local_128);
  cfd::core::Psbt::AddTxIn((Psbt *)&gtest_ar.message_,(TxInReference *)&gtest_ar_1.message_);
  local_2f0[1] = 2;
  local_2f0[0] = cfd::core::Psbt::GetTxInCount((Psbt *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_2e8,"2","psbt.GetTxInCount()",(int *)(local_2f0 + 1),local_2f0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x19b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  cfd::core::Psbt::GetData(&local_348,(Psbt *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_330,&local_348);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_310,
             "\"70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_330);
  cfd::core::ByteData::~ByteData(&local_348);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x19d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_388,(Psbt *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_368,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA=="
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x19e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  cfd::core::TxInReference::~TxInReference((TxInReference *)&gtest_ar_1.message_);
  cfd::core::TxIn::~TxIn((TxIn *)local_200);
  cfd::core::TxIn::~TxIn((TxIn *)local_128);
  cfd::core::Psbt::~Psbt((Psbt *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Psbt, SetTxInOnly) {
  Psbt psbt;
  EXPECT_EQ(0, psbt.GetTxInCount());
  TxIn txin_w(Txid("c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26"), 1, 0xffffffff);
  TxIn txin_l(Txid("c0ecc9313d16355d71b96acff5bca43cdb593289e50154bab12cff422a46257d"), 0, 0xffffffff);
  TxInReference txin_r(txin_l);
  psbt.AddTxIn(txin_w);
  psbt.AddTxIn(txin_r);
  EXPECT_EQ(2, psbt.GetTxInCount());

  EXPECT_STREQ("70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==", psbt.GetBase64().c_str());
}